

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O2

void __thiscall
Clasp::MinimizeBuilder::prepareLevels
          (MinimizeBuilder *this,Solver *s,SumVec *adjust,WeightVec *prios)

{
  weight_t *pwVar1;
  size_type sVar2;
  pointer puVar3;
  long lVar4;
  pointer pMVar5;
  pointer pMVar6;
  pointer pMVar7;
  pointer pMVar8;
  pointer pMVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  pointer pMVar14;
  weight_t P;
  wsum_t R;
  pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_> *local_40;
  Solver *local_38;
  
  pMVar14 = (this->lits_).ebo_.buf;
  local_38 = s;
  std::
  __stable_sort<Clasp::MinimizeBuilder::MLit*,__gnu_cxx::__ops::_Iter_comp_iter<Clasp::MinimizeBuilder::CmpPrio>>
            (pMVar14,pMVar14 + (this->lits_).ebo_.size);
  (prios->ebo_).size = 0;
  (adjust->ebo_).size = 0;
  pMVar14 = (this->lits_).ebo_.buf;
  pMVar5 = pMVar14 + (this->lits_).ebo_.size;
  pMVar8 = pMVar14;
  local_40 = &this->lits_;
  do {
    if (pMVar8 == pMVar5) {
      bk_lib::
      pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_>::erase
                (local_40,pMVar14,(local_40->ebo_).buf + (local_40->ebo_).size);
      return;
    }
    P = pMVar8->prio;
    sVar2 = (prios->ebo_).size;
    R = 0;
    puVar3 = (local_38->assign_).assign_.ebo_.buf;
    lVar4 = 0;
    while ((pMVar9 = pMVar5, pMVar8 != pMVar5 &&
           (pwVar1 = &pMVar8->prio, pMVar9 = pMVar8, *pwVar1 == P))) {
      uVar11 = (pMVar8->lit).rep_;
      uVar10 = (ulong)pMVar8->weight;
      pMVar7 = pMVar8;
      while (((pMVar6 = pMVar7 + 1, pMVar8 = pMVar5, pMVar6 != pMVar5 &&
              (uVar12 = (pMVar6->lit).rep_ ^ uVar11, pMVar8 = pMVar6, uVar12 < 4)) &&
             (pMVar8 = pMVar9 + 1, pMVar7[1].prio == *pwVar1))) {
        lVar13 = (long)pMVar7[1].weight;
        pMVar7 = pMVar6;
        if (uVar12 < 2) {
          uVar10 = uVar10 + lVar13;
          pMVar9 = pMVar8;
        }
        else {
          uVar10 = uVar10 - lVar13;
          R = lVar4 + lVar13;
          pMVar9 = pMVar6;
          lVar4 = R;
        }
      }
      if ((long)uVar10 < 0) {
        lVar4 = lVar4 + uVar10;
        uVar11 = uVar11 & 0xfffffffe ^ 2;
        uVar10 = -uVar10;
        R = lVar4;
LAB_0014c95f:
        if ((*(byte *)((long)puVar3 + (ulong)(uVar11 & 0xfffffffc)) & 3) != 0) goto LAB_0014c974;
        if (uVar10 >> 0x1f != 0) {
          Potassco::fail(0x4b,
                         "void Clasp::MinimizeBuilder::prepareLevels(const Solver &, SumVec &, WeightVec &)"
                         ,0x290,"static_cast<weight_t>(w) == w","MinimizeBuilder: weight too large",
                         0);
        }
        (pMVar14->lit).rep_ = uVar11;
        pMVar14->prio = sVar2;
        pMVar14->weight = (weight_t)uVar10;
        pMVar14 = pMVar14 + 1;
      }
      else {
        if (uVar10 != 0) goto LAB_0014c95f;
        uVar10 = 0;
LAB_0014c974:
        if ((byte)((byte)puVar3[uVar11 >> 2] & 3) == (byte)(2U - ((uVar11 & 2) == 0))) {
          lVar4 = lVar4 + uVar10;
          R = lVar4;
        }
      }
    }
    bk_lib::pod_vector<int,_std::allocator<int>_>::push_back(prios,&P);
    bk_lib::pod_vector<long,_std::allocator<long>_>::push_back(adjust,&R);
    pMVar8 = pMVar9;
  } while( true );
}

Assistant:

void MinimizeBuilder::prepareLevels(const Solver& s, SumVec& adjust, WeightVec& prios) {
	// group first by decreasing priorities and then by variables
	std::stable_sort(lits_.begin(), lits_.end(), CmpPrio());
	prios.clear(); adjust.clear();
	// assign levels and simplify lits
	LitVec::iterator j = lits_.begin();
	for (LitVec::const_iterator it = lits_.begin(), end = lits_.end(); it != end;) {
		const weight_t P = it->prio, L = static_cast<weight_t>(prios.size());
		wsum_t R = 0;
		for (LitVec::const_iterator k; it != end && it->prio == P; it = k) {
			Literal x(it->lit); // make literal unique wrt this level
			wsum_t  w = it->weight;
			for (k = it + 1; k != end && k->lit.var() == x.var() && k->prio == P; ++k) {
				if (k->lit == x){ w += k->weight; }
				else            { w -= k->weight; R += k->weight; }
			}
			if (w < 0){
				R += w;
				x  = ~x;
				w  = -w;
			}
			if (w && s.value(x.var()) == value_free) {
				POTASSCO_CHECK(static_cast<weight_t>(w) == w, EOVERFLOW, "MinimizeBuilder: weight too large");
				*j++ = MLit(WeightLiteral(x, static_cast<weight_t>(w)), L);
			}
			else if (s.isTrue(x)) { R += w; }
		}
		prios.push_back(P);
		adjust.push_back(R);
	}
	lits_.erase(j, lits_.end());
}